

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_args.cpp
# Opt level: O2

void node::ApplyArgsManOptions(ArgsManager *argsman,Options *options)

{
  optional<bool> oVar1;
  _Storage<long,_true> _Var2;
  uint32_t uVar3;
  _Storage<long,_true> _Var4;
  long in_FS_OFFSET;
  optional<long> oVar5;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-txreconciliation",&local_49);
  oVar1 = ArgsManager::GetBoolArg(argsman,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->reconcile_txs =
         oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-maxorphantx",&local_49);
  oVar5 = ArgsManager::GetIntArg(argsman,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    _Var2._M_value = 0xffffffff;
    if (oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload < 0xffffffff) {
      _Var2._M_value =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    _Var4._M_value = 0;
    if (0 < _Var2._M_value) {
      _Var4 = _Var2;
    }
    options->max_orphan_txs = (uint32_t)_Var4._M_value;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-blockreconstructionextratxn",&local_49);
  oVar5 = ArgsManager::GetIntArg(argsman,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    _Var2._M_value = 0xffffffff;
    if (oVar5.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload < 0xffffffff) {
      _Var2._M_value =
           oVar5.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    uVar3 = 0;
    if (0 < _Var2._M_value) {
      uVar3 = (uint32_t)_Var2._M_value;
    }
    options->max_extra_txs = uVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-capturemessages",&local_49);
  oVar1 = ArgsManager::GetBoolArg(argsman,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->capture_messages =
         oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"-blocksonly",&local_49);
  oVar1 = ArgsManager::GetBoolArg(argsman,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    options->ignore_incoming_txs =
         oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ApplyArgsManOptions(const ArgsManager& argsman, PeerManager::Options& options)
{
    if (auto value{argsman.GetBoolArg("-txreconciliation")}) options.reconcile_txs = *value;

    if (auto value{argsman.GetIntArg("-maxorphantx")}) {
        options.max_orphan_txs = uint32_t((std::clamp<int64_t>(*value, 0, std::numeric_limits<uint32_t>::max())));
    }

    if (auto value{argsman.GetIntArg("-blockreconstructionextratxn")}) {
        options.max_extra_txs = uint32_t((std::clamp<int64_t>(*value, 0, std::numeric_limits<uint32_t>::max())));
    }

    if (auto value{argsman.GetBoolArg("-capturemessages")}) options.capture_messages = *value;

    if (auto value{argsman.GetBoolArg("-blocksonly")}) options.ignore_incoming_txs = *value;
}